

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::done
          (store_coboundaries_in_cache_t *this)

{
  ostream *poVar1;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar1 = std::operator<<(poVar1,"dimension ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 8));
    poVar1 = std::operator<<(poVar1,": computed almost all of the coboundaries");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar1,"\r");
  }
  return;
}

Assistant:

void done() {
#ifdef INDICATE_PROGRESS
		if (is_first)
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed almost all of the coboundaries" << std::flush
			          << "\r";
#endif
	}